

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

quatd * tinyusdz::slerp(quatd *__return_storage_ptr__,quatd *a,quatd *b,double t)

{
  vec<double,_4> *in_RCX;
  vec<double,_4> local_48;
  double local_28;
  double dStack_20;
  double local_18;
  double dStack_10;
  
  local_28 = (a->imag)._M_elems[0];
  dStack_20 = (a->imag)._M_elems[1];
  local_18 = (a->imag)._M_elems[2];
  dStack_10 = a->real;
  local_48.x = (b->imag)._M_elems[0];
  local_48.y = (b->imag)._M_elems[1];
  local_48.z = (b->imag)._M_elems[2];
  local_48.w = b->real;
  linalg::slerp<double,4>
            ((vec<double,_4> *)__return_storage_ptr__,(linalg *)&local_28,&local_48,in_RCX,t);
  return __return_storage_ptr__;
}

Assistant:

value::quatd slerp(const value::quatd &a, const value::quatd &b, const double t) {

  linalg::vec<double, 4> qa;    
  linalg::vec<double, 4> qb;    
  linalg::vec<double, 4> qret;    

  memcpy(reinterpret_cast<value::quatd *>(&qa), &a, sizeof(double) * 4);
  memcpy(reinterpret_cast<value::quatd *>(&qb), &b, sizeof(double) * 4);

  qret = linalg::slerp(qa, qb, t);

  value::quatd ret;
  memcpy(&ret, reinterpret_cast<value::quatd *>(&qret), sizeof(double) * 4);
  return ret;
  
}